

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidget::QCalendarWidget(QCalendarWidget *this,QWidget *parent)

{
  undefined4 uVar1;
  QCalendarModel *pQVar2;
  undefined8 uVar3;
  QCalendarView *this_00;
  QCalendarWidgetPrivate *pQVar4;
  QLayout *this_01;
  QCalendarModel *this_02;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_03;
  QHeaderView *pQVar5;
  QItemSelectionModel *pQVar6;
  QCalendarDelegate *this_04;
  QCalendarTextNavigator *this_05;
  long in_FS_OFFSET;
  QAnyStringView QVar7;
  QMargins local_c8;
  QObject local_b0 [8];
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  undefined8 local_68;
  undefined4 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QCalendarWidgetPrivate *)operator_new(0x2e0);
  QCalendarWidgetPrivate::QCalendarWidgetPrivate(pQVar4);
  QWidget::QWidget(&this->super_QWidget,(QWidgetPrivate *)pQVar4,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007c88c8;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QCalendarWidget_007c8a80;
  pQVar4 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
  QWidget::setAutoFillBackground(&this->super_QWidget,true);
  QWidget::setBackgroundRole(&this->super_QWidget,Window);
  this_01 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_01,&this->super_QWidget);
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  uStack_40._0_4_ = 0;
  uStack_40._4_4_ = 0;
  QLayout::setContentsMargins(this_01,(QMargins *)local_48);
  this_02 = (QCalendarModel *)operator_new(0xe8);
  QtPrivate::QCalendarModel::QCalendarModel(this_02,(QObject *)this);
  pQVar4->m_model = this_02;
  local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_48);
  QBrush::QBrush((QBrush *)&local_c8,red,SolidPattern);
  QTextFormat::setForeground((QTextFormat *)local_48,(QBrush *)&local_c8);
  QBrush::~QBrush((QBrush *)&local_c8);
  pQVar2 = pQVar4->m_model;
  QTextFormat::QTextFormat((QTextFormat *)&local_58,(QTextFormat *)local_48);
  (pQVar2->m_dayFormats).contained[5] = true;
  uVar3 = *(undefined8 *)((pQVar2->m_dayFormats).data + 5);
  *(undefined8 *)((pQVar2->m_dayFormats).data + 5) = local_58;
  uVar1 = *(undefined4 *)&(pQVar2->m_dayFormats).data[5].field_0x8;
  *(undefined4 *)&(pQVar2->m_dayFormats).data[5].field_0x8 = local_50;
  local_58 = uVar3;
  local_50 = uVar1;
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  pQVar2 = pQVar4->m_model;
  QTextFormat::QTextFormat((QTextFormat *)&local_68,(QTextFormat *)local_48);
  (pQVar2->m_dayFormats).contained[6] = true;
  uVar3 = *(undefined8 *)((pQVar2->m_dayFormats).data + 6);
  *(undefined8 *)((pQVar2->m_dayFormats).data + 6) = local_68;
  uVar1 = *(undefined4 *)&(pQVar2->m_dayFormats).data[6].field_0x8;
  *(undefined4 *)&(pQVar2->m_dayFormats).data[6].field_0x8 = local_60;
  local_68 = uVar3;
  local_60 = uVar1;
  QTextFormat::~QTextFormat((QTextFormat *)&local_68);
  this_03.m_data = operator_new(0x30);
  QtPrivate::QCalendarView::QCalendarView((QCalendarView *)this_03.m_data,&this->super_QWidget);
  pQVar4->m_view = (QCalendarView *)this_03;
  QVar7.m_size = (size_t)"qt_calendar_calendarview";
  QVar7.field_0.m_data = this_03.m_data;
  QObject::setObjectName(QVar7);
  (**(code **)(*(long *)&(pQVar4->m_view->super_QTableView).super_QAbstractItemView.
                         super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))();
  this_00 = pQVar4->m_view;
  pQVar4->m_model->m_view = this_00;
  QAbstractItemView::setSelectionBehavior((QAbstractItemView *)this_00,SelectItems);
  QAbstractItemView::setSelectionMode((QAbstractItemView *)pQVar4->m_view,SingleSelection);
  pQVar5 = QTableView::horizontalHeader(&pQVar4->m_view->super_QTableView);
  QHeaderView::setSectionResizeMode(pQVar5,Stretch);
  pQVar5 = QTableView::horizontalHeader(&pQVar4->m_view->super_QTableView);
  QHeaderView::setSectionsClickable(pQVar5,false);
  pQVar5 = QTableView::verticalHeader(&pQVar4->m_view->super_QTableView);
  QHeaderView::setSectionResizeMode(pQVar5,Stretch);
  pQVar5 = QTableView::verticalHeader(&pQVar4->m_view->super_QTableView);
  QHeaderView::setSectionsClickable(pQVar5,false);
  pQVar6 = QAbstractItemView::selectionModel((QAbstractItemView *)pQVar4->m_view);
  pQVar4->m_selection = pQVar6;
  QCalendarWidgetPrivate::createNavigationBar(pQVar4,&this->super_QWidget);
  QFrame::setFrameStyle((QFrame *)pQVar4->m_view,0);
  this_04 = (QCalendarDelegate *)operator_new(0xe8);
  QtPrivate::QCalendarDelegate::QCalendarDelegate(this_04,pQVar4,(QObject *)this);
  pQVar4->m_delegate = this_04;
  QAbstractItemView::setItemDelegate
            ((QAbstractItemView *)pQVar4->m_view,(QAbstractItemDelegate *)this_04);
  QCalendarWidgetPrivate::update(pQVar4);
  QCalendarWidgetPrivate::updateNavigationBar(pQVar4);
  QWidget::setFocusPolicy(&this->super_QWidget,StrongFocus);
  QWidget::setFocusProxy(&this->super_QWidget,(QWidget *)pQVar4->m_view);
  QWidget::setSizePolicy(&this->super_QWidget,(QSizePolicy)0x550000);
  QObject::connect(local_70,(char *)pQVar4->m_view,(QObject *)"2showDate(QDate)",(char *)this,
                   0x6575a0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QObject::connect(local_78,(char *)pQVar4->m_view,(QObject *)"2changeDate(QDate,bool)",(char *)this
                   ,0x6575d0);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  QObject::connect(local_80,(char *)pQVar4->m_view,(QObject *)"2clicked(QDate)",(char *)this,
                   0x6575ef);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  QObject::connect(local_88,(char *)pQVar4->m_view,(QObject *)"2editingFinished()",(char *)this,
                   0x6574d6);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  QObject::connect(local_90,(char *)pQVar4->prevMonth,(QObject *)"2clicked(bool)",(char *)this,
                   0x65760e);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  QObject::connect(local_98,(char *)pQVar4->nextMonth,(QObject *)"2clicked(bool)",(char *)this,
                   0x657625);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  QObject::connect(local_a0,(char *)pQVar4->yearButton,(QObject *)"2clicked(bool)",(char *)this,
                   0x65763c);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QObject::connect(local_a8,(char *)pQVar4->monthMenu,(QObject *)"2triggered(QAction*)",(char *)this
                   ,0x657663);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  QObject::connect(local_b0,(char *)pQVar4->yearEdit,(QObject *)"2editingFinished()",(char *)this,
                   0x65767e);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  local_c8.m_left.m_i = 0;
  local_c8.m_top.m_i = 0;
  local_c8.m_right.m_i = 0;
  local_c8.m_bottom.m_i = 0;
  QLayout::setContentsMargins(this_01,&local_c8);
  (**(code **)(*(long *)this_01 + 0x68))(this_01,0);
  QBoxLayout::addWidget((QBoxLayout *)this_01,pQVar4->navBarBackground,0,(Alignment)0x0);
  QBoxLayout::addWidget((QBoxLayout *)this_01,(QWidget *)pQVar4->m_view,0,(Alignment)0x0);
  this_05 = (QCalendarTextNavigator *)operator_new(0x50);
  QtPrivate::QCalendarTextNavigator::QCalendarTextNavigator(this_05,(QObject *)this);
  pQVar4->m_navigator = this_05;
  setDateEditEnabled(this,true);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCalendarWidget::QCalendarWidget(QWidget *parent)
    : QWidget(*new QCalendarWidgetPrivate, parent, { })
{
    Q_D(QCalendarWidget);

    setAutoFillBackground(true);
    setBackgroundRole(QPalette::Window);

    QVBoxLayout *layoutV = new QVBoxLayout(this);
    layoutV->setContentsMargins(QMargins());
    d->m_model = new QCalendarModel(this);
    QTextCharFormat fmt;
    fmt.setForeground(QBrush(Qt::red));
    d->m_model->m_dayFormats.insert(Qt::Saturday, fmt);
    d->m_model->m_dayFormats.insert(Qt::Sunday, fmt);
    d->m_view = new QCalendarView(this);
    d->m_view->setObjectName("qt_calendar_calendarview"_L1);
    d->m_view->setModel(d->m_model);
    d->m_model->setView(d->m_view);
    d->m_view->setSelectionBehavior(QAbstractItemView::SelectItems);
    d->m_view->setSelectionMode(QAbstractItemView::SingleSelection);
    d->m_view->horizontalHeader()->setSectionResizeMode(QHeaderView::Stretch);
    d->m_view->horizontalHeader()->setSectionsClickable(false);
    d->m_view->verticalHeader()->setSectionResizeMode(QHeaderView::Stretch);
    d->m_view->verticalHeader()->setSectionsClickable(false);
    d->m_selection = d->m_view->selectionModel();
    d->createNavigationBar(this);
    d->m_view->setFrameStyle(QFrame::NoFrame);
    d->m_delegate = new QCalendarDelegate(d, this);
    d->m_view->setItemDelegate(d->m_delegate);
    d->update();
    d->updateNavigationBar();
    setFocusPolicy(Qt::StrongFocus);
    setFocusProxy(d->m_view);
    setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Preferred);

    connect(d->m_view, SIGNAL(showDate(QDate)),
            this, SLOT(_q_slotShowDate(QDate)));
    connect(d->m_view, SIGNAL(changeDate(QDate,bool)),
            this, SLOT(_q_slotChangeDate(QDate,bool)));
    connect(d->m_view, SIGNAL(clicked(QDate)),
            this, SIGNAL(clicked(QDate)));
    connect(d->m_view, SIGNAL(editingFinished()),
            this, SLOT(_q_editingFinished()));

    connect(d->prevMonth, SIGNAL(clicked(bool)),
            this, SLOT(_q_prevMonthClicked()));
    connect(d->nextMonth, SIGNAL(clicked(bool)),
            this, SLOT(_q_nextMonthClicked()));
    connect(d->yearButton, SIGNAL(clicked(bool)),
            this, SLOT(_q_yearClicked()));
    connect(d->monthMenu, SIGNAL(triggered(QAction*)),
            this, SLOT(_q_monthChanged(QAction*)));
    connect(d->yearEdit, SIGNAL(editingFinished()),
            this, SLOT(_q_yearEditingFinished()));

    layoutV->setContentsMargins(QMargins());
    layoutV->setSpacing(0);
    layoutV->addWidget(d->navBarBackground);
    layoutV->addWidget(d->m_view);

    d->m_navigator = new QCalendarTextNavigator(this);
    setDateEditEnabled(true);
}